

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clGetGLContextInfoKHR
                 (cl_context_properties *properties,cl_gl_context_info param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  bool bVar1;
  CLIntercept *this;
  cl_int errorCode;
  time_point end;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  time_point local_60;
  string local_58;
  uint64_t local_38;
  
  this = g_pIntercept;
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x20;
  }
  if ((g_pIntercept->m_Dispatch).clGetGLContextInfoKHR == (cl_api_clGetGLContextInfoKHR)0x0) {
    return -0x20;
  }
  local_38 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    CEnumNameMap::name_abi_cxx11_(&local_58,&g_pIntercept->m_EnumNameMap,param_name);
    CLIntercept::callLoggingEnter
              (this,"clGetGLContextInfoKHR",local_38,(cl_kernel)0x0,"param_name = %s (%08X)",
               local_58._M_dataplus._M_p,CONCAT44(uVar2,param_name));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clGetGLContextInfoKHR)
                        (properties,param_name,param_value_size,param_value,param_value_size_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_38 &&
        (local_38 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      CLIntercept::updateHostTimingStats(this,"clGetGLContextInfoKHR",&local_58,local_60,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  bVar1 = (this->m_Config).ErrorLogging;
  if ((bVar1 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013481b;
  }
  else if (errorCode == 0) {
    errorCode = 0;
    goto LAB_0013481b;
  }
  if (bVar1 != false) {
    CLIntercept::logError(this,"clGetGLContextInfoKHR",errorCode);
  }
  if ((this->m_Config).ErrorAssert == true) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0013481b:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clGetGLContextInfoKHR",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    CLIntercept::chromeCallLoggingExit(this,"clGetGLContextInfoKHR",&local_58,false,0,local_60,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetGLContextInfoKHR(
    const cl_context_properties *properties,
    cl_gl_context_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clGetGLContextInfoKHR )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "param_name = %s (%08X)",
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetGLContextInfoKHR(
            properties,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret);

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_PLATFORM);
}